

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_message_type(parser *p)

{
  int iVar1;
  long *plVar2;
  char *name;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar2 = (long *)parser_priv(p);
  if (plVar2 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0xac,"enum parser_error parse_player_timed_message_type(struct parser *)");
  }
  if (*plVar2 == 0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getsym(p,"type");
    iVar1 = message_lookup_by_name(name);
    *(int *)(*plVar2 + 0x30) = iVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
    if (*(int *)(*plVar2 + 0x30) < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_MESSAGE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_player_timed_message_type(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	ps->t->msgt = message_lookup_by_name(parser_getsym(p, "type"));
	return ps->t->msgt < 0 ?
		PARSE_ERROR_INVALID_MESSAGE : PARSE_ERROR_NONE;
}